

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarExecFuse.cpp
# Opt level: O0

int anon_unknown.dwarf_5c0f::grab_lock(string *lockfile)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  int *piVar4;
  LogFatal local_338;
  LogFatal local_1a0;
  int local_14;
  string *psStack_10;
  int fd;
  string *lockfile_local;
  
  psStack_10 = lockfile;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_14 = open(pcVar2,0x80042,0x180);
  if (local_14 < 0) {
    memset(&local_1a0,0,0x188);
    tools::xar::detail::LogFatal::LogFatal(&local_1a0);
    poVar3 = tools::xar::detail::LogFatal::stream(&local_1a0);
    poVar3 = std::operator<<(poVar3,"FATAL ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x80);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,"can\'t open lockfile: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar2);
    tools::xar::detail::LogFatal::~LogFatal(&local_1a0);
  }
  check_file_sanity(psStack_10,File,0x180);
  iVar1 = flock(local_14);
  if (iVar1 != 0) {
    memset(&local_338,0,0x188);
    tools::xar::detail::LogFatal::LogFatal(&local_338);
    poVar3 = tools::xar::detail::LogFatal::stream(&local_338);
    poVar3 = std::operator<<(poVar3,"FATAL ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x85);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,"can\'t flock lockfile: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar2);
    tools::xar::detail::LogFatal::~LogFatal(&local_338);
  }
  return local_14;
}

Assistant:

int grab_lock(const std::string& lockfile) {
  int fd = open(lockfile.c_str(), O_RDWR | O_CREAT | O_CLOEXEC, 0600);
  if (fd < 0) {
    XAR_FATAL << "can't open lockfile: " << strerror(errno);
  }

  check_file_sanity(lockfile, Expectation::File, 0600);
  if (flock(fd, LOCK_EX) != 0) {
    XAR_FATAL << "can't flock lockfile: " << strerror(errno);
  }

  return fd;
}